

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

void __thiscall
icu_63::TextTrieMap::put(TextTrieMap *this,UChar *key,void *value,UErrorCode *status)

{
  UBool UVar1;
  UVector *this_00;
  UVector *local_60;
  UChar *s;
  UErrorCode *status_local;
  void *value_local;
  UChar *key_local;
  TextTrieMap *this_local;
  
  this->fIsEmpty = '\0';
  if (this->fLazyContents == (UVector *)0x0) {
    this_00 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)key);
    local_60 = (UVector *)0x0;
    if (this_00 != (UVector *)0x0) {
      UVector::UVector(this_00,status);
      local_60 = this_00;
    }
    this->fLazyContents = local_60;
    if (this->fLazyContents == (UVector *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
  }
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    UVector::addElement(this->fLazyContents,key,status);
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      UVector::addElement(this->fLazyContents,value,status);
    }
    else if (this->fValueDeleter != (UObjectDeleter *)0x0) {
      (*this->fValueDeleter)(key);
    }
  }
  else if (this->fValueDeleter != (UObjectDeleter *)0x0) {
    (*this->fValueDeleter)(key);
  }
  return;
}

Assistant:

void
TextTrieMap::put(const UChar *key, void *value, UErrorCode &status) {
    fIsEmpty = FALSE;
    if (fLazyContents == NULL) {
        fLazyContents = new UVector(status);
        if (fLazyContents == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
        }
    }
    if (U_FAILURE(status)) {
        if (fValueDeleter) {
            fValueDeleter((void*) key);
        }
        return;
    }
    U_ASSERT(fLazyContents != NULL);

    UChar *s = const_cast<UChar *>(key);
    fLazyContents->addElement(s, status);
    if (U_FAILURE(status)) {
        if (fValueDeleter) {
            fValueDeleter((void*) key);
        }
        return;
    }

    fLazyContents->addElement(value, status);
}